

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::EqHelper<false>::Compare<int,__0>
          (char *expected_expression,char *actual_expression,int *expected,anon_enum_32 *actual)

{
  undefined8 in_RDI;
  AssertionResult AVar1;
  anon_enum_32 *unaff_retaddr;
  int *in_stack_00000008;
  
  AVar1 = CmpHelperEQ<int,__0>((char *)expected,(char *)actual,in_stack_00000008,unaff_retaddr);
  AVar1._0_8_ = in_RDI;
  return AVar1;
}

Assistant:

static AssertionResult Compare(const char* expected_expression,
                                 const char* actual_expression,
                                 const T1& expected,
                                 const T2& actual) {
    return CmpHelperEQ(expected_expression, actual_expression, expected,
                       actual);
  }